

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derOIDDec2(octet *der,size_t count,char *oid)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  uint val;
  u32 val_00;
  u32 t;
  size_t len;
  int local_48;
  u32 local_44;
  size_t local_40;
  ulong local_38;
  
  sVar3 = 0xffffffffffffffff;
  if ((((count != 0xffffffffffffffff) &&
       (sVar1 = derTLDec(&local_44,&local_40,der,count), sVar1 != 0xffffffffffffffff)) &&
      (local_38 = sVar1 + local_40, local_38 <= count)) && (local_44 == 6)) {
    if (local_40 != 0) {
      local_48 = 3;
      sVar3 = 0;
      val = 0;
      do {
        if (0x1ffffff < val) {
          return 0xffffffffffffffff;
        }
        val = der[sVar3 + sVar1] & 0x7f | val << 7;
        if (-1 < (char)der[sVar3 + sVar1]) {
          if (local_48 == 3) {
            val_00 = 0;
            if (0x27 < val) {
              if (val < 0x50) {
                val = val - 0x28;
                val_00 = 1;
              }
              else {
                val = val - 0x50;
                val_00 = 2;
              }
            }
            sVar2 = derSIDDec2(val_00,oid);
            if (sVar2 == 0xffffffffffffffff) {
              return 0xffffffffffffffff;
            }
            oid = oid + sVar2;
            local_48 = 0;
          }
          if (*oid != '.') {
            return 0xffffffffffffffff;
          }
          sVar2 = derSIDDec2(val,oid + 1);
          if (sVar2 == 0xffffffffffffffff) {
            return 0xffffffffffffffff;
          }
          oid = oid + 1 + sVar2;
          val = 0;
        }
        sVar3 = sVar3 + 1;
      } while (local_40 != sVar3);
    }
    sVar3 = -(ulong)(*oid != '\0') | local_38;
  }
  return sVar3;
}

Assistant:

size_t derOIDDec2(const octet der[], size_t count, const char* oid)
{
	u32 d1 = 3;
	u32 val = 0;
	size_t len, pos, oid_delta;
	// проверить входной буфер
	if (count == SIZE_MAX)
		return SIZE_MAX;
	ASSERT(memIsValid(der, count));
	// проверить тег и определить значение
	count = derDec2(&der, &len, der, count, 0x06);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// обработать sid
	for (pos = 0; pos < len; ++pos)
	{
		// переполнение?
		if (val & 0xFE000000)
			return SIZE_MAX;
		// лидирующий 0?
		if (val == 0 && der[pos] == 128)
			return SIZE_MAX;
		// обработать октет sid
		val <<= 7, val |= (size_t)der[pos] & 127;
		// последний октет sid?
		if ((der[pos] & 128) == 0)
		{
			// первый sid?
			if (d1 == 3)
			{
				if (val < 40)
					d1 = 0;
				else if (val < 80)
					d1 = 1, val -= 40;
				else
					d1 = 2, val -= 80;
				oid_delta = derSIDDec2(d1, oid);
				if (oid_delta == SIZE_MAX)
					return SIZE_MAX;
				oid += oid_delta, d1 = 0;
			}
			// добавить ".val"
			if (*oid != '.')
				return SIZE_MAX;
			++oid;
			oid_delta = derSIDDec2(val, oid);
			if (oid_delta == SIZE_MAX)
				return SIZE_MAX;
			// к следующему sid
			oid += oid_delta, val = 0;
		}
	}
	// очистка и выход
	d1 = val = 0, pos = len = 0;
	if (*oid != '\0')
		return SIZE_MAX;
	return count;
}